

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageFlipVertical(Image *image)

{
  int iVar1;
  void *pvVar2;
  int local_28;
  int local_24;
  int offsetSize;
  int i;
  uchar *flippedData;
  int bytesPerPixel;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (image->format < 0xb) {
      iVar1 = GetPixelDataSize(1,1,image->format);
      pvVar2 = malloc((long)(image->width * image->height * iVar1));
      local_24 = image->height;
      local_28 = 0;
      while (local_24 = local_24 + -1, -1 < local_24) {
        memcpy((void *)((long)pvVar2 + (long)local_28),
               (void *)((long)image->data + (long)(local_24 * image->width * iVar1)),
               (long)(image->width * iVar1));
        local_28 = image->width * iVar1 + local_28;
      }
      free(image->data);
      image->data = pvVar2;
    }
    else {
      TraceLog(4,"Image manipulation not supported for compressed formats");
    }
  }
  return;
}

Assistant:

void ImageFlipVertical(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *flippedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int i = (image->height - 1), offsetSize = 0; i >= 0; i--)
        {
            memcpy(flippedData + offsetSize, ((unsigned char *)image->data) + i*image->width*bytesPerPixel, image->width*bytesPerPixel);
            offsetSize += image->width*bytesPerPixel;
        }

        RL_FREE(image->data);
        image->data = flippedData;
    }
}